

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O2

int __thiscall TrodesConfig::copy(TrodesConfig *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  TrodesConfig *this_00;
  const_reference pvVar1;
  const_reference pvVar2;
  size_type sVar3;
  NTrodeObj local_c0;
  NDevice local_78;
  
  this_00 = (TrodesConfig *)operator_new(0x38);
  TrodesConfig(this_00);
  for (sVar3 = 0;
      (long)sVar3 <
      (long)(int)(((long)(this->devices).super__Vector_base<NDevice,_std::allocator<NDevice>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->devices).super__Vector_base<NDevice,_std::allocator<NDevice>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0x48); sVar3 = sVar3 + 1) {
    pvVar1 = std::vector<NDevice,_std::allocator<NDevice>_>::at(&this->devices,sVar3);
    NDevice::NDevice(&local_78,pvVar1);
    std::vector<NDevice,_std::allocator<NDevice>_>::push_back(&this_00->devices,&local_78);
    NDevice::~NDevice(&local_78);
  }
  for (sVar3 = 0;
      (long)sVar3 <
      (long)(int)(((long)(this->nTrodes).super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->nTrodes).super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0x48); sVar3 = sVar3 + 1) {
    pvVar2 = std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::at(&this->nTrodes,sVar3);
    NTrodeObj::NTrodeObj(&local_c0,pvVar2);
    std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::push_back(&this_00->nTrodes,&local_c0);
    NTrodeObj::~NTrodeObj(&local_c0);
  }
  return (int)this_00;
}

Assistant:

TrodesConfig* TrodesConfig::copy() const {
    TrodesConfig* newObj = new TrodesConfig();
//    TrodesConfig newObj

    for (int i = 0; i < (int)devices.size(); i++) {
        newObj->addDevice(devices.at(i));
    }
    for (int i = 0; i < (int)nTrodes.size(); i++) {
        newObj->addNTrode(nTrodes.at(i));
    }
    return(newObj);
}